

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O2

QString * __thiscall
QDateTime::toString(QString *__return_storage_ptr__,QDateTime *this,DateFormat format)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  int iVar4;
  uint uVar5;
  QDateTimePrivate *pQVar6;
  void *i;
  long in_FS_OFFSET;
  QLatin1StringView str;
  pair<QDate,_QTime> pVar7;
  QStringView format_00;
  QStringBuilder<char16_t,_QString> local_b8;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<char16_t> local_78;
  undefined1 local_58 [8];
  char16_t *pcStack_50;
  qsizetype local_48;
  qint64 local_40;
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.size = 0;
  local_78.d = (Data *)0x0;
  local_78.ptr = (char16_t *)0x0;
  pQVar6 = (this->d).d;
  if (((ulong)pQVar6 & 1) == 0) {
    pQVar6 = (QDateTimePrivate *)
             (ulong)(pQVar6->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
                    super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
  }
  if (((ulong)pQVar6 & 8) == 0) {
LAB_0030f3fa:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    if ((format == ISODate) || (format == ISODateWithMs)) {
      pcStack_50 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      pVar7 = getDateTime(&this->d);
      local_58 = (undefined1  [8])pVar7.first.jd;
      pcStack_50 = (char16_t *)CONCAT44(pcStack_50._4_4_,pVar7.second.mds.mds);
      toStringIsoDate((QString *)&local_b8,(QDate)local_58);
      qVar3 = local_78.size;
      pcVar2 = local_78.ptr;
      pDVar1 = local_78.d;
      local_78.d = (Data *)local_b8._0_8_;
      local_78.ptr = (char16_t *)local_b8.b.d.d;
      local_b8._0_8_ = pDVar1;
      local_b8.b.d.d = (Data *)pcVar2;
      local_78.size = (qsizetype)local_b8.b.d.ptr;
      local_b8.b.d.ptr = (char16_t *)qVar3;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
      if ((char16_t *)local_78.size == (char16_t *)0x0) goto LAB_0030f3fa;
      QTime::toString((QString *)&local_98,(QTime *)&pcStack_50,format);
      local_b8.b.d.size = local_98.size;
      local_b8.b.d.ptr = local_98.ptr;
      local_b8.b.d.d = local_98.d;
      local_b8.a = 0x54;
      local_98.d = (Data *)0x0;
      local_98.ptr = (char16_t *)0x0;
      local_98.size = 0;
      ::operator+=((QString *)&local_78,&local_b8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8.b.d);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
      pQVar6 = (this->d).d;
      if (((ulong)pQVar6 & 1) == 0) {
        pQVar6 = (QDateTimePrivate *)
                 (ulong)(pQVar6->m_status).
                        super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
                        super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
      }
      if (1 < ((uint)((ulong)pQVar6 >> 4) & 3) - 2) {
        if (((ulong)pQVar6 >> 4 & 3) != 0) {
          QString::append((QString *)&local_78,(QChar)0x5a);
        }
        goto LAB_0030f796;
      }
      iVar4 = offsetFromUtc(this);
      toOffsetString((QString *)&local_b8,ISODate,iVar4);
      QString::append((QString *)&local_78,(QString *)&local_b8);
LAB_0030f78e:
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
    }
    else {
      if (format == RFC2822Date) {
        QLocale::c(&local_98,this);
        format_00.m_data = L"dd MMM yyyy hh:mm:ss ";
        format_00.m_size = 0x15;
        QLocale::toString((QString *)&local_b8,(QLocale *)&local_98,this,format_00);
        qVar3 = local_78.size;
        pcVar2 = local_78.ptr;
        pDVar1 = local_78.d;
        local_78.d = (Data *)local_b8._0_8_;
        local_78.ptr = (char16_t *)local_b8.b.d.d;
        local_b8._0_8_ = pDVar1;
        local_b8.b.d.d = (Data *)pcVar2;
        local_78.size = (qsizetype)local_b8.b.d.ptr;
        local_b8.b.d.ptr = (char16_t *)qVar3;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
        QLocale::~QLocale((QLocale *)&local_98);
        iVar4 = offsetFromUtc(this);
        toOffsetString((QString *)&local_b8,TextDate,iVar4);
        QString::append((QString *)&local_78,(QString *)&local_b8);
        goto LAB_0030f78e;
      }
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      pVar7 = getDateTime(&this->d);
      local_40 = (qint64)pVar7.first.jd;
      local_38 = (undefined1 *)CONCAT44(local_38._4_4_,pVar7.second.mds.mds);
      toStringTextDate((QString *)&local_b8,(QDate)local_40);
      qVar3 = local_78.size;
      pcVar2 = local_78.ptr;
      pDVar1 = local_78.d;
      local_78.d = (Data *)local_b8._0_8_;
      local_78.ptr = (char16_t *)local_b8.b.d.d;
      local_b8._0_8_ = pDVar1;
      local_b8.b.d.d = (Data *)pcVar2;
      local_78.size = (qsizetype)local_b8.b.d.ptr;
      local_b8.b.d.ptr = (char16_t *)qVar3;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
      i = (void *)QString::lastIndexOf((QString *)&local_78,(QChar)0x20,CaseSensitive);
      QTime::toString((QString *)local_58,(QTime *)&local_38,TextDate);
      local_b8.b.d.size = local_48;
      local_b8.b.d.ptr = pcStack_50;
      local_b8.b.d.d = (Data *)local_58;
      local_b8.a = 0x20;
      local_58 = (undefined1  [8])0x0;
      pcStack_50 = (char16_t *)0x0;
      local_48 = 0;
      QStringBuilder<char16_t,_QString>::convertTo<QString>((QString *)&local_98,&local_b8);
      QString::insert((QString *)&local_78,(qsizetype)i,(QString *)&local_98);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8.b.d);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_58);
      pQVar6 = (this->d).d;
      if (((ulong)pQVar6 & 1) == 0) {
        uVar5 = (pQVar6->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
                super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
      }
      else {
        uVar5 = (uint)pQVar6;
      }
      uVar5 = uVar5 >> 4 & 3;
      if (uVar5 != 0) {
        if (uVar5 == 3) {
          QLocale::c(local_58,i);
          QTimeZone::displayName
                    ((QString *)&local_98,&pQVar6->m_timeZone,this,OffsetName,(QLocale *)local_58);
          local_b8.b.d.size = local_98.size;
          local_b8.b.d.ptr = local_98.ptr;
          local_b8.b.d.d = local_98.d;
          local_b8.a = 0x20;
          local_98.d = (Data *)0x0;
          local_98.ptr = (char16_t *)0x0;
          local_98.size = 0;
          ::operator+=((QString *)&local_78,&local_b8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8.b.d);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
          QLocale::~QLocale((QLocale *)local_58);
        }
        else {
          str.m_data = " GMT";
          str.m_size = 4;
          QString::append((QString *)&local_78,str);
          pQVar6 = (this->d).d;
          if (((ulong)pQVar6 & 1) == 0) {
            pQVar6 = (QDateTimePrivate *)
                     (ulong)(pQVar6->m_status).
                            super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
                            super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
          }
          if (((uint)pQVar6 & 0x30) == 0x20) {
            iVar4 = offsetFromUtc(this);
            toOffsetString((QString *)&local_b8,TextDate,iVar4);
            QString::append((QString *)&local_78,(QString *)&local_b8);
            goto LAB_0030f78e;
          }
        }
      }
    }
LAB_0030f796:
    qVar3 = local_78.size;
    pcVar2 = local_78.ptr;
    pDVar1 = local_78.d;
    local_78.d = (Data *)0x0;
    local_78.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = pcVar2;
    local_78.size = 0;
    (__return_storage_ptr__->d).size = qVar3;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QDateTime::toString(Qt::DateFormat format) const
{
    QString buf;
    if (!isValid())
        return buf;

    switch (format) {
    case Qt::RFC2822Date:
        buf = QLocale::c().toString(*this, u"dd MMM yyyy hh:mm:ss ");
        buf += toOffsetString(Qt::TextDate, offsetFromUtc());
        return buf;
    default:
    case Qt::TextDate: {
        const std::pair<QDate, QTime> p = getDateTime(d);
        buf = toStringTextDate(p.first);
        // Insert time between date's day and year:
        buf.insert(buf.lastIndexOf(u' '),
                   u' ' + p.second.toString(Qt::TextDate));
        // Append zone/offset indicator, as appropriate:
        switch (timeSpec()) {
        case Qt::LocalTime:
            break;
#if QT_CONFIG(timezone)
        case Qt::TimeZone:
            buf += u' ' + d->m_timeZone.displayName(
                *this, QTimeZone::OffsetName, QLocale::c());
            break;
#endif
        default:
#if 0 // ### Qt 7 GMT: use UTC instead, see qnamespace.qdoc documentation
            buf += " UTC"_L1;
#else
            buf += " GMT"_L1;
#endif
            if (getSpec(d) == Qt::OffsetFromUTC)
                buf += toOffsetString(Qt::TextDate, offsetFromUtc());
        }
        return buf;
    }
    case Qt::ISODate:
    case Qt::ISODateWithMs: {
        const std::pair<QDate, QTime> p = getDateTime(d);
        buf = toStringIsoDate(p.first);
        if (buf.isEmpty())
            return QString();   // failed to convert
        buf += u'T' + p.second.toString(format);
        switch (getSpec(d)) {
        case Qt::UTC:
            buf += u'Z';
            break;
        case Qt::OffsetFromUTC:
        case Qt::TimeZone:
            buf += toOffsetString(Qt::ISODate, offsetFromUtc());
            break;
        default:
            break;
        }
        return buf;
    }
    }
}